

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetShaderTypeLiteralName(SHADER_TYPE ShaderType)

{
  char *pcVar1;
  uint *in_RCX;
  uint *Args_1;
  string msg;
  SHADER_TYPE local_2c;
  string local_28;
  
  Args_1 = &switchD_0027e4f0::switchdataD_002ee2b4;
  switch(ShaderType) {
  case SHADER_TYPE_UNKNOWN:
    pcVar1 = "SHADER_TYPE_UNKNOWN";
    break;
  case SHADER_TYPE_VERTEX:
    pcVar1 = "SHADER_TYPE_VERTEX";
    break;
  case SHADER_TYPE_PIXEL:
    pcVar1 = "SHADER_TYPE_PIXEL";
    break;
  case SHADER_TYPE_GEOMETRY:
    pcVar1 = "SHADER_TYPE_GEOMETRY";
    break;
  case SHADER_TYPE_HULL:
    pcVar1 = "SHADER_TYPE_HULL";
    break;
  default:
    if (ShaderType == SHADER_TYPE_DOMAIN) {
      return "SHADER_TYPE_DOMAIN";
    }
    if (ShaderType == SHADER_TYPE_COMPUTE) {
      return "SHADER_TYPE_COMPUTE";
    }
    if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
      return "SHADER_TYPE_AMPLIFICATION";
    }
    if (ShaderType == SHADER_TYPE_MESH) {
      return "SHADER_TYPE_MESH";
    }
    if (ShaderType == SHADER_TYPE_RAY_GEN) {
      return "SHADER_TYPE_RAY_GEN";
    }
    if (ShaderType == SHADER_TYPE_RAY_MISS) {
      return "SHADER_TYPE_RAY_MISS";
    }
    if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
      return "SHADER_TYPE_RAY_CLOSEST_HIT";
    }
    if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
      return "SHADER_TYPE_RAY_ANY_HIT";
    }
    if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
      return "SHADER_TYPE_RAY_INTERSECTION";
    }
    if (ShaderType == SHADER_TYPE_CALLABLE) {
      return "SHADER_TYPE_CALLABLE";
    }
    Args_1 = in_RCX;
    if (ShaderType == SHADER_TYPE_LAST) {
      return "SHADER_TYPE_TILE";
    }
  case SHADER_TYPE_VS_PS:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
    local_2c = ShaderType;
    FormatString<char[30],unsigned_int>
              (&local_28,(Diligent *)"Unknown shader type constant ",(char (*) [30])&local_2c,Args_1
              );
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x325);
    std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "<Unknown shader type>";
  }
  return pcVar1;
}

Assistant:

const Char* GetShaderTypeLiteralName(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
#define RETURN_SHADER_TYPE_NAME(ShaderType)\
        case ShaderType: return #ShaderType;

        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_UNKNOWN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_VERTEX          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_PIXEL           )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_GEOMETRY        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_HULL            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_DOMAIN          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_COMPUTE         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_AMPLIFICATION   )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_MESH            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_GEN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_MISS        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_CLOSEST_HIT )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_ANY_HIT     )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_INTERSECTION)
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_CALLABLE        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_TILE            )
#undef  RETURN_SHADER_TYPE_NAME
            // clang-format on

        default: UNEXPECTED("Unknown shader type constant ", Uint32{ShaderType}); return "<Unknown shader type>";
    }
}